

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

ostream * libDAI::operator<<(ostream *os,TFactor<double> *P)

{
  pointer pdVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  
  poVar2 = std::operator<<(os,"(");
  poVar2 = operator<<(poVar2,&P->_vs);
  std::operator<<(poVar2," <");
  for (uVar3 = 0;
      pdVar1 = (P->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(P->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar3 = uVar3 + 1) {
    poVar2 = std::ostream::_M_insert<double>(pdVar1[uVar3]);
    std::operator<<(poVar2," ");
  }
  std::operator<<(os,">)");
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const TFactor<T>& P) {
        os << "(" << P.vars() << " <";
        for( size_t i = 0; i < P._p.size(); i++ )
            os << P._p[i] << " ";
        os << ">)";
        return os;
    }